

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O2

int translate_code(lemon *lemp,rule *rp)

{
  byte bVar1;
  uint uVar2;
  char *__s1;
  ushort *puVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  byte *pbVar8;
  ushort **ppuVar9;
  size_t sVar10;
  symbol *psVar11;
  char *pcVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  char **ppcVar16;
  byte *__s1_00;
  byte *pbVar17;
  long lVar18;
  bool bVar19;
  int local_7f8;
  char zLhs [50];
  char used [1000];
  char zOvwrt [900];
  
  uVar2 = rp->nrhs;
  uVar13 = 0;
  uVar14 = 0;
  if (0 < (int)uVar2) {
    uVar14 = (ulong)uVar2;
  }
  for (; uVar14 != uVar13; uVar13 = uVar13 + 1) {
    used[uVar13] = '\0';
  }
  bVar19 = rp->code == (char *)0x0;
  if (bVar19) {
    rp->code = translate_code::newlinestr;
    rp->line = rp->ruleline;
  }
  rp->noCode = (uint)bVar19;
  if (uVar2 == 0) {
    bVar19 = false;
    pbVar8 = (byte *)0x0;
  }
  else {
    pcVar12 = *rp->rhsalias;
    if (pcVar12 == (char *)0x0) {
      iVar6 = has_destructor(*rp->rhs,lemp);
      if (iVar6 == 0) goto LAB_0010a861;
      bVar19 = false;
      append_str((char *)0x0,0,0,0,0);
      append_str("  yy_destructor(yypParser,%d,&yymsp[%d].minor);\n",0,(*rp->rhs)->index,
                 1 - rp->nrhs,0);
      pcVar12 = append_str((char *)0x0,0,0,0,0);
      pcVar12 = Strsafe(pcVar12);
      rp->codePrefix = pcVar12;
      rp->noCode = 0;
    }
    else {
      __s1 = rp->lhsalias;
      if (__s1 != (char *)0x0) {
        iVar6 = strcmp(__s1,pcVar12);
        if (iVar6 == 0) {
          used[0] = '\x01';
          bVar19 = true;
          if (rp->lhs->dtnum != (*rp->rhs)->dtnum) {
            ErrorMsg(lemp->filename,rp->ruleline,
                     "%s(%s) and %s(%s) share the same label but have different datatypes.",
                     rp->lhs->name,__s1,(*rp->rhs)->name,pcVar12);
            lemp->errorcnt = lemp->errorcnt + 1;
          }
          goto LAB_0010a867;
        }
        bVar19 = false;
        sprintf(zOvwrt,"/*%s-overwrites-%s*/",__s1);
        pbVar8 = (byte *)strstr(rp->code,zOvwrt);
        if (pbVar8 == (byte *)0x0) {
          bVar19 = false;
          sprintf(zLhs,"yylhsminor.yy%d",(ulong)(uint)rp->lhs->dtnum);
          bVar5 = true;
          pbVar8 = (byte *)0x0;
          local_7f8 = 1;
          goto LAB_0010a8a2;
        }
        goto LAB_0010a86b;
      }
LAB_0010a861:
      bVar19 = false;
    }
LAB_0010a867:
    pbVar8 = (byte *)0x0;
  }
LAB_0010a86b:
  local_7f8 = 0;
  sprintf(zLhs,"yymsp[%d].minor.yy%d",(ulong)(1 - rp->nrhs));
  bVar5 = false;
LAB_0010a8a2:
  append_str((char *)0x0,0,0,0,0);
  __s1_00 = (byte *)rp->code;
  bVar4 = false;
  do {
    bVar1 = *__s1_00;
    if ((ulong)bVar1 == 0) {
      pcVar12 = append_str((char *)0x0,0,0,0,0);
      if ((pcVar12 != (char *)0x0) && (*pcVar12 != '\0')) {
        pcVar12 = Strsafe(pcVar12);
        rp->code = pcVar12;
      }
      append_str((char *)0x0,0,0,0,0);
      pcVar12 = rp->lhsalias;
      if (!bVar19 && pcVar12 != (char *)0x0) {
        ErrorMsg(lemp->filename,rp->ruleline,"Label \"%s\" for \"%s(%s)\" is never used.",pcVar12,
                 rp->lhs->name,pcVar12);
        lemp->errorcnt = lemp->errorcnt + 1;
      }
      lVar18 = 0;
      do {
        iVar6 = rp->nrhs;
        if (iVar6 <= lVar18) {
          if (bVar5) {
            append_str("  yymsp[%d].minor.yy%d = ",0,1 - iVar6,rp->lhs->dtnum,0);
            append_str(zLhs,0,0,0,0);
            append_str(";\n",0,0,0,0);
          }
          pcVar12 = append_str((char *)0x0,0,0,0,0);
          if ((pcVar12 != (char *)0x0) && (*pcVar12 != '\0')) {
            pcVar12 = Strsafe(pcVar12);
            rp->codeSuffix = pcVar12;
            rp->noCode = 0;
          }
          return local_7f8;
        }
        ppcVar16 = rp->rhsalias;
        if (ppcVar16[lVar18] == (char *)0x0) {
          if (lVar18 != 0) {
            psVar11 = rp->rhs[lVar18];
            iVar7 = has_destructor(psVar11,lemp);
            if (iVar7 != 0) {
              append_str("  yy_destructor(yypParser,%d,&yymsp[%d].minor);\n",0,psVar11->index,
                         ((int)lVar18 - iVar6) + 1,0);
            }
          }
        }
        else {
          if (lVar18 != 0) {
            if ((rp->lhsalias != (char *)0x0) &&
               (iVar6 = strcmp(rp->lhsalias,ppcVar16[lVar18]), iVar6 == 0)) {
              ErrorMsg(lemp->filename,rp->ruleline,
                       "%s(%s) has the same label as the LHS but is not the left-most symbol on the RHS."
                      );
              lemp->errorcnt = lemp->errorcnt + 1;
              ppcVar16 = rp->rhsalias;
            }
            for (lVar15 = 0; lVar18 != lVar15; lVar15 = lVar15 + 1) {
              if ((ppcVar16[lVar15] != (char *)0x0) &&
                 (iVar6 = strcmp(ppcVar16[lVar15],ppcVar16[lVar18]), iVar6 == 0)) {
                ErrorMsg(lemp->filename,rp->ruleline,
                         "Label %s used for multiple symbols on the RHS of a rule.");
                lemp->errorcnt = lemp->errorcnt + 1;
                break;
              }
            }
          }
          if (used[lVar18] == '\0') {
            ErrorMsg(lemp->filename,rp->ruleline,"Label %s for \"%s(%s)\" is never used.",
                     rp->rhsalias[lVar18],rp->rhs[lVar18]->name,rp->rhsalias[lVar18]);
            lemp->errorcnt = lemp->errorcnt + 1;
          }
        }
        lVar18 = lVar18 + 1;
      } while( true );
    }
    if (__s1_00 == pbVar8) {
      append_str(zOvwrt,0,0,0,0);
      sVar10 = strlen(zOvwrt);
      __s1_00 = __s1_00 + ((int)sVar10 + -1);
      bVar4 = true;
    }
    else {
      ppuVar9 = __ctype_b_loc();
      puVar3 = *ppuVar9;
      if (((*(byte *)((long)puVar3 + (ulong)bVar1 * 2 + 1) & 4) != 0) &&
         ((pbVar17 = __s1_00, __s1_00 == (byte *)rp->code ||
          ((__s1_00[-1] != 0x5f && ((puVar3[__s1_00[-1]] & 8) == 0)))))) {
        do {
          do {
            bVar1 = pbVar17[1];
            pbVar17 = pbVar17 + 1;
          } while (bVar1 == 0x5f);
        } while ((puVar3[bVar1] & 8) != 0);
        *pbVar17 = 0;
        if ((rp->lhsalias == (char *)0x0) ||
           (iVar6 = strcmp((char *)__s1_00,rp->lhsalias), iVar6 != 0)) {
          uVar2 = rp->nrhs;
          uVar13 = 0;
          if (0 < (int)uVar2) {
            uVar13 = (ulong)uVar2;
          }
          for (uVar14 = 0; uVar13 != uVar14; uVar14 = uVar14 + 1) {
            ppcVar16 = rp->rhsalias;
            pcVar12 = ppcVar16[uVar14];
            if ((pcVar12 != (char *)0x0) && (iVar6 = strcmp((char *)__s1_00,pcVar12), iVar6 == 0)) {
              if (bVar4 && uVar14 == 0) {
                ErrorMsg(lemp->filename,rp->ruleline,"Label %s used after \'%s\'.",*ppcVar16,zOvwrt)
                ;
                lemp->errorcnt = lemp->errorcnt + 1;
              }
              else if ((__s1_00 == (byte *)rp->code) || (__s1_00[-1] != 0x40)) {
                psVar11 = rp->rhs[uVar14];
                if (psVar11->type == MULTITERMINAL) {
                  psVar11 = *psVar11->subsym;
                }
                append_str("yymsp[%d].minor.yy%d",0,((int)uVar14 - uVar2) + 1,psVar11->dtnum,0);
              }
              else {
                append_str("yymsp[%d].major",-1,((int)uVar14 - uVar2) + 1,0,0);
              }
              used[uVar14] = '\x01';
              __s1_00 = pbVar17;
              break;
            }
          }
        }
        else {
          append_str(zLhs,0,0,0,0);
          bVar19 = true;
          __s1_00 = pbVar17;
        }
        *pbVar17 = bVar1;
      }
      append_str((char *)__s1_00,1,0,0,1);
    }
    __s1_00 = __s1_00 + 1;
  } while( true );
}

Assistant:

PRIVATE int translate_code(struct lemon *lemp, struct rule *rp){
  char *cp, *xp;
  int i;
  int rc = 0;            /* True if yylhsminor is used */
  int dontUseRhs0 = 0;   /* If true, use of left-most RHS label is illegal */
  const char *zSkip = 0; /* The zOvwrt comment within rp->code, or NULL */
  char lhsused = 0;      /* True if the LHS element has been used */
  char lhsdirect;        /* True if LHS writes directly into stack */
  char used[MAXRHS];     /* True for each RHS element which is used */
  char zLhs[50];         /* Convert the LHS symbol into this string */
  char zOvwrt[900];      /* Comment that to allow LHS to overwrite RHS */

  for(i=0; i<rp->nrhs; i++) used[i] = 0;
  lhsused = 0;

  if( rp->code==0 ){
    static char newlinestr[2] = { '\n', '\0' };
    rp->code = newlinestr;
    rp->line = rp->ruleline;
    rp->noCode = 1;
  }else{
    rp->noCode = 0;
  }

  if( rp->nrhs==0 ){
    /* If there are no RHS symbols, then writing directly to the LHS is ok */
    lhsdirect = 1;
  }else if( rp->rhsalias[0]==0 ){
    /* The left-most RHS symbol has not value.  LHS direct is ok.  But
    ** we have to call the distructor on the RHS symbol first. */
    lhsdirect = 1;
    if( has_destructor(rp->rhs[0],lemp) ){
      append_str(0,0,0,0,0);
      append_str("  yy_destructor(yypParser,%d,&yymsp[%d].minor);\n", 0,
                 rp->rhs[0]->index,1-rp->nrhs,0);
      rp->codePrefix = Strsafe(append_str(0,0,0,0,0));
      rp->noCode = 0;
    }
  }else if( rp->lhsalias==0 ){
    /* There is no LHS value symbol. */
    lhsdirect = 1;
  }else if( strcmp(rp->lhsalias,rp->rhsalias[0])==0 ){
    /* The LHS symbol and the left-most RHS symbol are the same, so 
    ** direct writing is allowed */
    lhsdirect = 1;
    lhsused = 1;
    used[0] = 1;
    if( rp->lhs->dtnum!=rp->rhs[0]->dtnum ){
      ErrorMsg(lemp->filename,rp->ruleline,
        "%s(%s) and %s(%s) share the same label but have "
        "different datatypes.",
        rp->lhs->name, rp->lhsalias, rp->rhs[0]->name, rp->rhsalias[0]);
      lemp->errorcnt++;
    }
  }else{
    sprintf(zOvwrt, "/*%s-overwrites-%s*/", rp->lhsalias, rp->rhsalias[0]);
    zSkip = strstr(rp->code, zOvwrt);
    if( zSkip!=0 ){
      /* The code contains a special comment that indicates that it is safe
      ** for the LHS label to overwrite left-most RHS label. */
      lhsdirect = 1;
    }else{
      lhsdirect = 0;
    }
  }
  if( lhsdirect ){
    sprintf(zLhs, "yymsp[%d].minor.yy%d",1-rp->nrhs,rp->lhs->dtnum);
  }else{
    rc = 1;
    sprintf(zLhs, "yylhsminor.yy%d",rp->lhs->dtnum);
  }

  append_str(0,0,0,0,0);

  /* This const cast is wrong but harmless, if we're careful. */
  for(cp=(char *)rp->code; *cp; cp++){
    if( cp==zSkip ){
      append_str(zOvwrt,0,0,0,0);
      cp += lemonStrlen(zOvwrt)-1;
      dontUseRhs0 = 1;
      continue;
    }
    if( ISALPHA(*cp) && (cp==rp->code || (!ISALNUM(cp[-1]) && cp[-1]!='_')) ){
      char saved;
      for(xp= &cp[1]; ISALNUM(*xp) || *xp=='_'; xp++);
      saved = *xp;
      *xp = 0;
      if( rp->lhsalias && strcmp(cp,rp->lhsalias)==0 ){
        append_str(zLhs,0,0,0,0);
        cp = xp;
        lhsused = 1;
      }else{
        for(i=0; i<rp->nrhs; i++){
          if( rp->rhsalias[i] && strcmp(cp,rp->rhsalias[i])==0 ){
            if( i==0 && dontUseRhs0 ){
              ErrorMsg(lemp->filename,rp->ruleline,
                 "Label %s used after '%s'.",
                 rp->rhsalias[0], zOvwrt);
              lemp->errorcnt++;
            }else if( cp!=rp->code && cp[-1]=='@' ){
              /* If the argument is of the form @X then substituted
              ** the token number of X, not the value of X */
              append_str("yymsp[%d].major",-1,i-rp->nrhs+1,0,0);
            }else{
              struct symbol *sp = rp->rhs[i];
              int dtnum;
              if( sp->type==MULTITERMINAL ){
                dtnum = sp->subsym[0]->dtnum;
              }else{
                dtnum = sp->dtnum;
              }
              append_str("yymsp[%d].minor.yy%d",0,i-rp->nrhs+1, dtnum,0);
            }
            cp = xp;
            used[i] = 1;
            break;
          }
        }
      }
      *xp = saved;
    }
    append_str(cp, 1, 0, 0, 1);
  } /* End loop */

  /* Main code generation completed */
  cp = append_str(0,0,0,0,0);
  if( cp && cp[0] ) rp->code = Strsafe(cp);
  append_str(0,0,0,0,0);

  /* Check to make sure the LHS has been used */
  if( rp->lhsalias && !lhsused ){
    ErrorMsg(lemp->filename,rp->ruleline,
      "Label \"%s\" for \"%s(%s)\" is never used.",
        rp->lhsalias,rp->lhs->name,rp->lhsalias);
    lemp->errorcnt++;
  }

  /* Generate destructor code for RHS minor values which are not referenced.
  ** Generate error messages for unused labels and duplicate labels.
  */
  for(i=0; i<rp->nrhs; i++){
    if( rp->rhsalias[i] ){
      if( i>0 ){
        int j;
        if( rp->lhsalias && strcmp(rp->lhsalias,rp->rhsalias[i])==0 ){
          ErrorMsg(lemp->filename,rp->ruleline,
            "%s(%s) has the same label as the LHS but is not the left-most "
           "symbol on the RHS.",
            rp->rhs[i]->name, rp->rhsalias);
          lemp->errorcnt++;
        }
        for(j=0; j<i; j++){
          if( rp->rhsalias[j] && strcmp(rp->rhsalias[j],rp->rhsalias[i])==0 ){
            ErrorMsg(lemp->filename,rp->ruleline,
              "Label %s used for multiple symbols on the RHS of a rule.",
              rp->rhsalias[i]);
            lemp->errorcnt++;
            break;
          }
        }
      }
      if( !used[i] ){
        ErrorMsg(lemp->filename,rp->ruleline,
          "Label %s for \"%s(%s)\" is never used.",
          rp->rhsalias[i],rp->rhs[i]->name,rp->rhsalias[i]);
        lemp->errorcnt++;
      }
    }else if( i>0 && has_destructor(rp->rhs[i],lemp) ){
      append_str("  yy_destructor(yypParser,%d,&yymsp[%d].minor);\n", 0,
         rp->rhs[i]->index,i-rp->nrhs+1,0);
    }
  }

  /* If unable to write LHS values directly into the stack, write the
  ** saved LHS value now. */
  if( lhsdirect==0 ){
    append_str("  yymsp[%d].minor.yy%d = ", 0, 1-rp->nrhs, rp->lhs->dtnum, 0);
    append_str(zLhs, 0, 0, 0, 0);
    append_str(";\n", 0, 0, 0, 0);
  }

  /* Suffix code generation complete */
  cp = append_str(0,0,0,0,0);
  if( cp && cp[0] ){
    rp->codeSuffix = Strsafe(cp);
    rp->noCode = 0;
  }

  return rc;
}